

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMatrix4x4.cpp
# Opt level: O0

void __thiscall
utMatrix4x4_indexOperatorTest_Test::TestBody(utMatrix4x4_indexOperatorTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_15;
  ai_real *a15;
  Message local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_14;
  ai_real *a14;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_13;
  ai_real *a13;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_12;
  ai_real *a12;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_11;
  ai_real *a11;
  Message local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_10;
  ai_real *a10;
  Message local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_9;
  ai_real *a9;
  Message local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_8;
  ai_real *a8;
  Message local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_7;
  ai_real *a7;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_6;
  ai_real *a6;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_5;
  ai_real *a5;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_4;
  ai_real *a4;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  ai_real *a3;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  ai_real *a2;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  ai_real *a1;
  Message local_80 [3];
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  ai_real *a0;
  aiMatrix4x4 m;
  utMatrix4x4_indexOperatorTest_Test *this_local;
  
  m._56_8_ = this;
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&a0);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)&a0,0);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_68,"1.0","*a0",1.0,*(float *)gtest_ar.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a1,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a1);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &(gtest_ar.message_.ptr_)->field_0x4;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_a0,"0.0","*a1",0.0,*(float *)gtest_ar_1.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a2,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a2);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &(gtest_ar.message_.ptr_)->_M_string_length;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_c8,"0.0","*a2",0.0,*(float *)gtest_ar_2.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a3,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a3);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  gtest_ar_3.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(gtest_ar.message_.ptr_)->_M_string_length + 4);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_f0,"0.0","*a3",0.0,*(float *)gtest_ar_3.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a4,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a4);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  gtest_ar_4.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)&a0,1);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_118,"0.0","*a4",0.0,*(float *)gtest_ar_4.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a5,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a5);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  gtest_ar_5.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &(gtest_ar_4.message_.ptr_)->field_0x4;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_140,"1.0","*a5",1.0,*(float *)gtest_ar_5.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a6,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a6);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  gtest_ar_6.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &(gtest_ar_4.message_.ptr_)->_M_string_length;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_168,"0.0","*a6",0.0,*(float *)gtest_ar_6.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a7,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a7);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  gtest_ar_7.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(gtest_ar_4.message_.ptr_)->_M_string_length + 4);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_190,"0.0","*a7",0.0,*(float *)gtest_ar_7.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a8,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a8);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  gtest_ar_8.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)&a0,2);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_1b8,"0.0","*a8",0.0,*(float *)gtest_ar_8.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a9,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a9,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a9);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  gtest_ar_9.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &(gtest_ar_8.message_.ptr_)->field_0x4;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_1e0,"0.0","*a9",0.0,*(float *)gtest_ar_9.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a10,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a10);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  gtest_ar_10.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &(gtest_ar_8.message_.ptr_)->_M_string_length;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_208,"1.0","*a10",1.0,*(float *)gtest_ar_10.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a11,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a11);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  gtest_ar_11.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(gtest_ar_8.message_.ptr_)->_M_string_length + 4);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_230,"0.0","*a11",0.0,*(float *)gtest_ar_11.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a12,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a12);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  gtest_ar_12.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)&a0,3);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_258,"0.0","*a12",0.0,*(float *)gtest_ar_12.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a13,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a13);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  gtest_ar_13.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &(gtest_ar_12.message_.ptr_)->field_0x4;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_280,"0.0","*a13",0.0,*(float *)gtest_ar_13.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a14,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a14);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  gtest_ar_14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &(gtest_ar_12.message_.ptr_)->_M_string_length;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_2a8,"0.0","*a14",0.0,*(float *)gtest_ar_14.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a15,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a15,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a15);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  gtest_ar_15.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(gtest_ar_12.message_.ptr_)->_M_string_length + 4);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_2d0,"1.0","*a15",1.0,*(float *)gtest_ar_15.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  return;
}

Assistant:

TEST_F( utMatrix4x4, indexOperatorTest ) {
    aiMatrix4x4 m;
    ai_real *a0 = m[ 0 ];
    EXPECT_FLOAT_EQ( 1.0, *a0 );
    ai_real *a1 = a0+1;
    EXPECT_FLOAT_EQ( 0.0, *a1 );
    ai_real *a2 = a0 + 2;
    EXPECT_FLOAT_EQ( 0.0, *a2 );
    ai_real *a3 = a0 + 3;
    EXPECT_FLOAT_EQ( 0.0, *a3 );

    ai_real *a4 = m[ 1 ];
    EXPECT_FLOAT_EQ( 0.0, *a4 );
    ai_real *a5 = a4 + 1;
    EXPECT_FLOAT_EQ( 1.0, *a5 );
    ai_real *a6 = a4 + 2;
    EXPECT_FLOAT_EQ( 0.0, *a6 );
    ai_real *a7 = a4 + 3;
    EXPECT_FLOAT_EQ( 0.0, *a7 );

    ai_real *a8 = m[ 2 ];
    EXPECT_FLOAT_EQ( 0.0, *a8 );
    ai_real *a9 = a8 + 1;
    EXPECT_FLOAT_EQ( 0.0, *a9 );
    ai_real *a10 = a8 + 2;
    EXPECT_FLOAT_EQ( 1.0, *a10 );
    ai_real *a11 = a8 + 3;
    EXPECT_FLOAT_EQ( 0.0, *a11 );

    ai_real *a12 = m[ 3 ];
    EXPECT_FLOAT_EQ( 0.0, *a12 );
    ai_real *a13 = a12 + 1;
    EXPECT_FLOAT_EQ( 0.0, *a13 );
    ai_real *a14 = a12 + 2;
    EXPECT_FLOAT_EQ( 0.0, *a14 );
    ai_real *a15 = a12 + 3;
    EXPECT_FLOAT_EQ( 1.0, *a15 );
}